

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabbox3d.h
# Opt level: O2

bool __thiscall
irr::core::aabbox3d<float>::intersectsWithBox(aabbox3d<float> *this,aabbox3d<float> *other)

{
  if (((((this->MinEdge).X <= (other->MaxEdge).X) && ((this->MinEdge).Y <= (other->MaxEdge).Y)) &&
      ((this->MinEdge).Z <= (other->MaxEdge).Z)) &&
     (((other->MinEdge).X <= (this->MaxEdge).X && ((other->MinEdge).Y <= (this->MaxEdge).Y)))) {
    return (other->MinEdge).Z <= (this->MaxEdge).Z;
  }
  return false;
}

Assistant:

bool intersectsWithBox(const aabbox3d<T> &other) const
	{
		return (MinEdge.X <= other.MaxEdge.X && MinEdge.Y <= other.MaxEdge.Y && MinEdge.Z <= other.MaxEdge.Z &&
				MaxEdge.X >= other.MinEdge.X && MaxEdge.Y >= other.MinEdge.Y && MaxEdge.Z >= other.MinEdge.Z);
	}